

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void write_buffer_8x8(__m128i *in,uint16_t *output,int stride,int fliplr,int flipud,int shift,int bd
                     )

{
  uint16_t *puVar1;
  undefined4 in_register_0000000c;
  longlong extraout_RDX;
  undefined4 in_register_00000084;
  longlong lVar3;
  undefined4 in_register_0000008c;
  longlong lVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  int fliplr_00;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  int fliplr_01;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  int bd_00;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  int bd_01;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  __m128i res_lo;
  __m128i res_lo_00;
  __m128i res_lo_01;
  __m128i res_lo_02;
  __m128i res_lo_03;
  __m128i res_lo_04;
  __m128i res_lo_05;
  __m128i res_lo_06;
  __m128i res_lo_07;
  __m128i res_lo_08;
  __m128i res_lo_09;
  __m128i res_lo_10;
  __m128i res_lo_11;
  __m128i res_lo_12;
  __m128i pred;
  __m128i pred_00;
  __m128i pred_01;
  __m128i pred_02;
  __m128i pred_03;
  __m128i pred_04;
  __m128i pred_05;
  __m128i pred_06;
  __m128i pred_07;
  __m128i pred_08;
  __m128i pred_09;
  __m128i pred_10;
  __m128i pred_11;
  __m128i pred_12;
  __m128i pred_13;
  __m128i res_hi;
  __m128i res_hi_00;
  __m128i res_hi_01;
  __m128i res_hi_02;
  __m128i res_hi_03;
  __m128i res_hi_04;
  __m128i res_hi_05;
  __m128i res_hi_06;
  __m128i res_hi_07;
  __m128i res_hi_08;
  __m128i res_hi_09;
  __m128i res_hi_10;
  __m128i res_hi_11;
  __m128i res_hi_12;
  __m128i res_hi_13;
  __m128i alVar5;
  int fliplr_02;
  undefined8 local_e8;
  undefined4 uStack_e4;
  int bd_02;
  undefined8 uStack_e0;
  undefined4 uStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  longlong lVar2;
  
  lVar4 = CONCAT44(in_register_0000008c,shift);
  lVar3 = CONCAT44(in_register_00000084,flipud);
  lVar2 = CONCAT44(in_register_0000000c,fliplr);
  round_shift_8x8(in,shift);
  fliplr_02 = (int)*(undefined8 *)(output + stride * 4);
  bd_02 = (int)*(undefined8 *)(output + stride * 4 + 4);
  if (flipud == 0) {
    pred_06[0] = (ulong)(uint)fliplr;
    alVar5[1] = lVar2;
    alVar5[0] = extraout_RDX;
    pred_06[1]._0_4_ = bd;
    pred_06[1]._4_4_ = 0;
    res_hi_06[1] = lVar4;
    res_hi_06[0] = lVar3;
    alVar5 = get_recon_8x8(pred_06,alVar5,res_hi_06,fliplr_02,bd_02);
    res_lo_06[0] = alVar5[1];
    pred_07[0] = (ulong)(uint)fliplr;
    res_lo_06[1] = lVar2;
    pred_07[1]._0_4_ = bd;
    pred_07[1]._4_4_ = 0;
    res_hi_07[1] = lVar4;
    res_hi_07[0] = lVar3;
    alVar5 = get_recon_8x8(pred_07,res_lo_06,res_hi_07,fliplr_02,bd_02);
    res_lo_07[0] = alVar5[1];
    local_98 = CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_06);
    uStack_90 = CONCAT44(extraout_XMM0_Dd_07,extraout_XMM0_Dc_06);
    pred_08[0] = (ulong)(uint)fliplr;
    res_lo_07[1] = lVar2;
    pred_08[1]._0_4_ = bd;
    pred_08[1]._4_4_ = 0;
    res_hi_08[1] = lVar4;
    res_hi_08[0] = lVar3;
    alVar5 = get_recon_8x8(pred_08,res_lo_07,res_hi_08,fliplr_02,bd_02);
    res_lo_08[0] = alVar5[1];
    local_b8 = CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_07);
    uStack_b0 = CONCAT44(extraout_XMM0_Dd_08,extraout_XMM0_Dc_07);
    pred_09[0] = (ulong)(uint)fliplr;
    res_lo_08[1] = lVar2;
    pred_09[1]._0_4_ = bd;
    pred_09[1]._4_4_ = 0;
    res_hi_09[1] = lVar4;
    res_hi_09[0] = lVar3;
    alVar5 = get_recon_8x8(pred_09,res_lo_08,res_hi_09,fliplr_02,bd_02);
    res_lo_09[0] = alVar5[1];
    local_d8 = CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_08);
    uStack_d0 = CONCAT44(extraout_XMM0_Dd_09,extraout_XMM0_Dc_08);
    pred_10[0] = (ulong)(uint)fliplr;
    res_lo_09[1] = lVar2;
    pred_10[1]._0_4_ = bd;
    pred_10[1]._4_4_ = 0;
    res_hi_10[1] = lVar4;
    res_hi_10[0] = lVar3;
    alVar5 = get_recon_8x8(pred_10,res_lo_09,res_hi_10,fliplr_02,bd_02);
    res_lo_10[0] = alVar5[1];
    local_e8 = CONCAT44(extraout_XMM0_Db_10,fliplr_01);
    uStack_e0 = CONCAT44(extraout_XMM0_Dd_10,bd_01);
    pred_11[0] = (ulong)(uint)fliplr;
    res_lo_10[1] = lVar2;
    pred_11[1]._0_4_ = bd;
    pred_11[1]._4_4_ = 0;
    res_hi_11[1] = lVar4;
    res_hi_11[0] = lVar3;
    alVar5 = get_recon_8x8(pred_11,res_lo_10,res_hi_11,fliplr_01,bd_01);
    res_lo_11[0] = alVar5[1];
    local_c8 = CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_09);
    uStack_c0 = CONCAT44(extraout_XMM0_Dd_11,extraout_XMM0_Dc_09);
    pred_12[0] = (ulong)(uint)fliplr;
    res_lo_11[1] = lVar2;
    pred_12[1]._0_4_ = bd;
    pred_12[1]._4_4_ = 0;
    res_hi_12[1] = lVar4;
    res_hi_12[0] = lVar3;
    alVar5 = get_recon_8x8(pred_12,res_lo_11,res_hi_12,fliplr_01,bd_01);
    lVar2 = alVar5[1];
    local_a8 = CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_10);
    uStack_a0 = CONCAT44(extraout_XMM0_Dd_12,extraout_XMM0_Dc_10);
    in = in + 0xe;
    local_58 = extraout_XMM0_Da_05;
    uStack_54 = extraout_XMM0_Db_06;
    uStack_50 = extraout_XMM0_Dc_05;
    uStack_4c = extraout_XMM0_Dd_06;
  }
  else {
    pred[0] = (ulong)(uint)fliplr;
    res_lo[1] = lVar2;
    res_lo[0] = extraout_RDX;
    pred[1]._0_4_ = bd;
    pred[1]._4_4_ = 0;
    res_hi[1] = lVar4;
    res_hi[0] = lVar3;
    alVar5 = get_recon_8x8(pred,res_lo,res_hi,fliplr_02,bd_02);
    res_lo_00[0] = alVar5[1];
    pred_00[0] = (ulong)(uint)fliplr;
    res_lo_00[1] = lVar2;
    pred_00[1]._0_4_ = bd;
    pred_00[1]._4_4_ = 0;
    res_hi_00[1] = lVar4;
    res_hi_00[0] = lVar3;
    alVar5 = get_recon_8x8(pred_00,res_lo_00,res_hi_00,fliplr_02,bd_02);
    res_lo_01[0] = alVar5[1];
    local_98 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    uStack_90 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
    pred_01[0] = (ulong)(uint)fliplr;
    res_lo_01[1] = lVar2;
    pred_01[1]._0_4_ = bd;
    pred_01[1]._4_4_ = 0;
    res_hi_01[1] = lVar4;
    res_hi_01[0] = lVar3;
    alVar5 = get_recon_8x8(pred_01,res_lo_01,res_hi_01,fliplr_02,bd_02);
    res_lo_02[0] = alVar5[1];
    local_b8 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    uStack_b0 = CONCAT44(extraout_XMM0_Dd_01,extraout_XMM0_Dc_01);
    pred_02[0] = (ulong)(uint)fliplr;
    res_lo_02[1] = lVar2;
    pred_02[1]._0_4_ = bd;
    pred_02[1]._4_4_ = 0;
    res_hi_02[1] = lVar4;
    res_hi_02[0] = lVar3;
    alVar5 = get_recon_8x8(pred_02,res_lo_02,res_hi_02,fliplr_02,bd_02);
    res_lo_03[0] = alVar5[1];
    local_d8 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
    uStack_d0 = CONCAT44(extraout_XMM0_Dd_02,extraout_XMM0_Dc_02);
    pred_03[0] = (ulong)(uint)fliplr;
    res_lo_03[1] = lVar2;
    pred_03[1]._0_4_ = bd;
    pred_03[1]._4_4_ = 0;
    res_hi_03[1] = lVar4;
    res_hi_03[0] = lVar3;
    alVar5 = get_recon_8x8(pred_03,res_lo_03,res_hi_03,fliplr_02,bd_02);
    res_lo_04[0] = alVar5[1];
    local_e8 = CONCAT44(extraout_XMM0_Db_03,fliplr_00);
    uStack_e0 = CONCAT44(extraout_XMM0_Dd_03,bd_00);
    pred_04[0] = (ulong)(uint)fliplr;
    res_lo_04[1] = lVar2;
    pred_04[1]._0_4_ = bd;
    pred_04[1]._4_4_ = 0;
    res_hi_04[1] = lVar4;
    res_hi_04[0] = lVar3;
    alVar5 = get_recon_8x8(pred_04,res_lo_04,res_hi_04,fliplr_00,bd_00);
    res_lo_05[0] = alVar5[1];
    local_c8 = CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_03);
    uStack_c0 = CONCAT44(extraout_XMM0_Dd_04,extraout_XMM0_Dc_03);
    pred_05[0] = (ulong)(uint)fliplr;
    res_lo_05[1] = lVar2;
    pred_05[1]._0_4_ = bd;
    pred_05[1]._4_4_ = 0;
    res_hi_05[1] = lVar4;
    res_hi_05[0] = lVar3;
    alVar5 = get_recon_8x8(pred_05,res_lo_05,res_hi_05,fliplr_00,bd_00);
    lVar2 = alVar5[1];
    local_a8 = CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_04);
    uStack_a0 = CONCAT44(extraout_XMM0_Dd_05,extraout_XMM0_Dc_04);
    local_58 = extraout_XMM0_Da;
    uStack_54 = extraout_XMM0_Db;
    uStack_50 = extraout_XMM0_Dc;
    uStack_4c = extraout_XMM0_Dd;
  }
  pred_13[0] = (ulong)(uint)fliplr;
  res_lo_12[1] = (longlong)in;
  res_lo_12[0] = lVar2;
  pred_13[1]._0_4_ = bd;
  pred_13[1]._4_4_ = 0;
  res_hi_13[1] = lVar4;
  res_hi_13[0] = lVar3;
  get_recon_8x8(pred_13,res_lo_12,res_hi_13,fliplr_02,bd_02);
  *(ulong *)output = CONCAT44(uStack_54,local_58);
  *(ulong *)(output + 4) = CONCAT44(uStack_4c,uStack_50);
  *(undefined8 *)(output + stride) = local_98;
  *(undefined8 *)(output + stride + 4) = uStack_90;
  *(undefined8 *)(output + stride * 2) = local_b8;
  *(undefined8 *)(output + stride * 2 + 4) = uStack_b0;
  *(undefined8 *)(output + stride * 3) = local_d8;
  *(undefined8 *)(output + stride * 3 + 4) = uStack_d0;
  *(undefined8 *)(output + stride * 4) = local_e8;
  *(undefined8 *)(output + stride * 4 + 4) = uStack_e0;
  *(undefined8 *)(output + stride * 5) = local_c8;
  *(undefined8 *)(output + stride * 5 + 4) = uStack_c0;
  *(undefined8 *)(output + stride * 6) = local_a8;
  *(undefined8 *)(output + stride * 6 + 4) = uStack_a0;
  puVar1 = output + stride * 7;
  *(undefined4 *)puVar1 = extraout_XMM0_Da_11;
  *(undefined4 *)(puVar1 + 2) = extraout_XMM0_Db_13;
  *(undefined4 *)(puVar1 + 4) = extraout_XMM0_Dc_11;
  *(undefined4 *)(puVar1 + 6) = extraout_XMM0_Dd_13;
  return;
}

Assistant:

static void write_buffer_8x8(__m128i *in, uint16_t *output, int stride,
                             int fliplr, int flipud, int shift, int bd) {
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;

  round_shift_8x8(in, shift);

  v0 = _mm_load_si128((__m128i const *)(output + 0 * stride));
  v1 = _mm_load_si128((__m128i const *)(output + 1 * stride));
  v2 = _mm_load_si128((__m128i const *)(output + 2 * stride));
  v3 = _mm_load_si128((__m128i const *)(output + 3 * stride));
  v4 = _mm_load_si128((__m128i const *)(output + 4 * stride));
  v5 = _mm_load_si128((__m128i const *)(output + 5 * stride));
  v6 = _mm_load_si128((__m128i const *)(output + 6 * stride));
  v7 = _mm_load_si128((__m128i const *)(output + 7 * stride));

  if (flipud) {
    u0 = get_recon_8x8(v0, in[14], in[15], fliplr, bd);
    u1 = get_recon_8x8(v1, in[12], in[13], fliplr, bd);
    u2 = get_recon_8x8(v2, in[10], in[11], fliplr, bd);
    u3 = get_recon_8x8(v3, in[8], in[9], fliplr, bd);
    u4 = get_recon_8x8(v4, in[6], in[7], fliplr, bd);
    u5 = get_recon_8x8(v5, in[4], in[5], fliplr, bd);
    u6 = get_recon_8x8(v6, in[2], in[3], fliplr, bd);
    u7 = get_recon_8x8(v7, in[0], in[1], fliplr, bd);
  } else {
    u0 = get_recon_8x8(v0, in[0], in[1], fliplr, bd);
    u1 = get_recon_8x8(v1, in[2], in[3], fliplr, bd);
    u2 = get_recon_8x8(v2, in[4], in[5], fliplr, bd);
    u3 = get_recon_8x8(v3, in[6], in[7], fliplr, bd);
    u4 = get_recon_8x8(v4, in[8], in[9], fliplr, bd);
    u5 = get_recon_8x8(v5, in[10], in[11], fliplr, bd);
    u6 = get_recon_8x8(v6, in[12], in[13], fliplr, bd);
    u7 = get_recon_8x8(v7, in[14], in[15], fliplr, bd);
  }

  _mm_store_si128((__m128i *)(output + 0 * stride), u0);
  _mm_store_si128((__m128i *)(output + 1 * stride), u1);
  _mm_store_si128((__m128i *)(output + 2 * stride), u2);
  _mm_store_si128((__m128i *)(output + 3 * stride), u3);
  _mm_store_si128((__m128i *)(output + 4 * stride), u4);
  _mm_store_si128((__m128i *)(output + 5 * stride), u5);
  _mm_store_si128((__m128i *)(output + 6 * stride), u6);
  _mm_store_si128((__m128i *)(output + 7 * stride), u7);
}